

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * fmt::v6::internal::write_exponent<wchar_t,wchar_t*>(int exp,wchar_t *it)

{
  wchar_t *pwVar1;
  ulong uVar2;
  
  if (exp < 0) {
    *it = L'-';
    exp = -exp;
  }
  else {
    *it = L'+';
  }
  pwVar1 = it + 1;
  if (99 < exp) {
    uVar2 = (ulong)((uint)exp / 100 + (uint)exp / 100);
    if (999 < exp) {
      it[1] = (int)(char)basic_data<void>::digits[uVar2];
      pwVar1 = it + 2;
    }
    exp = (uint)exp % 100;
    *pwVar1 = (int)(char)basic_data<void>::digits[uVar2 + 1];
    pwVar1 = pwVar1 + 1;
  }
  *pwVar1 = (int)(char)basic_data<void>::digits[(ulong)(uint)exp * 2];
  pwVar1[1] = (int)(char)basic_data<void>::digits[(ulong)(uint)exp * 2 + 1];
  return pwVar1 + 2;
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}